

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_1::PosixEnv::SleepForMicroseconds(PosixEnv *this,int micros)

{
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  timespec __ts;
  timespec local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < micros) {
    local_20.tv_sec = (ulong)(uint)micros / 1000000;
    local_20.tv_nsec = ((ulong)(uint)micros % 1000000) * 1000;
    do {
      iVar1 = nanosleep(&local_20,&local_20);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SleepForMicroseconds(int micros) override {
    std::this_thread::sleep_for(std::chrono::microseconds(micros));
  }